

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

int Ifn_ManSatCheckOne(sat_solver *pSat,Vec_Int_t *vPoVars,word *pTruth,int nVars,int *pPerm,
                      int nInps,Vec_Int_t *vLits)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int Var;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int i;
  uint uVar9;
  uint i_00;
  
  uVar2 = 1 << ((byte)nVars & 0x1f);
  bVar1 = (byte)nInps & 0x1f;
  uVar9 = 1 << bVar1;
  if (uVar9 != vPoVars->nSize) {
    __assert_fail("(1 << nInps) == Vec_IntSize(vPoVars)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x299,
                  "int Ifn_ManSatCheckOne(sat_solver *, Vec_Int_t *, word *, int, int *, int, Vec_Int_t *)"
                 );
  }
  if (nInps < nVars) {
    __assert_fail("nVars <= nInps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                  ,0x29a,
                  "int Ifn_ManSatCheckOne(sat_solver *, Vec_Int_t *, word *, int, int *, int, Vec_Int_t *)"
                 );
  }
  Vec_IntGrow(vLits,uVar9);
  uVar5 = 0;
  uVar6 = 0;
  if (0 < 1 << bVar1) {
    uVar6 = (ulong)uVar9;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    vLits->pArray[uVar5] = -1;
  }
  vLits->nSize = uVar9;
  uVar5 = (ulong)(uint)nInps;
  if (nInps < 1) {
    uVar5 = 0;
  }
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  uVar6 = 0;
  while( true ) {
    uVar9 = (uint)uVar6;
    if (uVar9 == uVar2) break;
    i_00 = 0;
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      if (nVars <= pPerm[uVar7]) {
        __assert_fail("pPerm[v] < nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                      ,0x2a2,
                      "int Ifn_ManSatCheckOne(sat_solver *, Vec_Int_t *, word *, int, int *, int, Vec_Int_t *)"
                     );
      }
      uVar8 = 1 << ((byte)uVar7 & 0x1f);
      if ((uVar9 >> (pPerm[uVar7] & 0x1fU) & 1) == 0) {
        uVar8 = 0;
      }
      i_00 = i_00 | uVar8;
    }
    iVar3 = Vec_IntEntry(vLits,i_00);
    if (iVar3 != -1) {
      __assert_fail("Vec_IntEntry(vLits, mNew) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTune.c"
                    ,0x2a6,
                    "int Ifn_ManSatCheckOne(sat_solver *, Vec_Int_t *, word *, int, int *, int, Vec_Int_t *)"
                   );
    }
    Vec_IntWriteEntry(vLits,i_00,(uint)((pTruth[uVar6 >> 6] >> (uVar6 & 0x3f) & 1) != 0));
    uVar6 = (ulong)(uVar9 + 1);
  }
  iVar3 = 0;
  for (i = 0; i < vLits->nSize; i = i + 1) {
    iVar4 = Vec_IntEntry(vLits,i);
    if (-1 < iVar4) {
      Var = Vec_IntEntry(vPoVars,i);
      iVar4 = Abc_Var2Lit(Var,(uint)(iVar4 == 0));
      Vec_IntWriteEntry(vLits,iVar3,iVar4);
      iVar3 = iVar3 + 1;
    }
  }
  if (iVar3 <= vLits->nSize) {
    vLits->nSize = iVar3;
    iVar3 = sat_solver_solve(pSat,vLits->pArray,vLits->pArray + iVar3,0,0,0,0);
    return (int)(iVar3 == 1);
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
}

Assistant:

int Ifn_ManSatCheckOne( sat_solver * pSat, Vec_Int_t * vPoVars, word * pTruth, int nVars, int * pPerm, int nInps, Vec_Int_t * vLits )
{
    int v, Value, m, mNew, nMints = (1 << nVars); // (1 << nInps);
    assert( (1 << nInps) == Vec_IntSize(vPoVars) );
    assert( nVars <= nInps );
    // remap minterms
    Vec_IntFill( vLits, Vec_IntSize(vPoVars), -1 );
    for ( m = 0; m < nMints; m++ )
    {
        mNew = 0;
        for ( v = 0; v < nInps; v++ )
        {
            assert( pPerm[v] < nVars );
            if ( ((m >> pPerm[v]) & 1) )
                mNew |= (1 << v);
        }
        assert( Vec_IntEntry(vLits, mNew) == -1 );
        Vec_IntWriteEntry( vLits, mNew, Abc_TtGetBit(pTruth, m) );
    }
    // find assumptions
    v = 0;
    Vec_IntForEachEntry( vLits, Value, m )
        if ( Value >= 0 )
            Vec_IntWriteEntry( vLits, v++, Abc_Var2Lit(Vec_IntEntry(vPoVars, m), !Value) );
    Vec_IntShrink( vLits, v );
    // run SAT solver
    Value = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), 0, 0, 0, 0 );
    return (int)(Value == l_True);
}